

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O1

boolean encode_mcu_DC_first(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  jpeg_entropy_encoder *pjVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  _func_boolean_j_compress_ptr_JBLOCKROW_ptr *p_Var9;
  uint uVar10;
  long lVar11;
  long lVar12;
  undefined4 local_5c;
  
  pjVar2 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    if (*(int *)&pjVar2[4].start_pass == 0) {
      emit_restart(cinfo,*(int *)((long)&pjVar2[4].start_pass + 4));
      *(uint *)&pjVar2[4].start_pass = cinfo->restart_interval;
      *(uint *)((long)&pjVar2[4].start_pass + 4) =
           *(int *)((long)&pjVar2[4].start_pass + 4) + 1U & 7;
    }
    *(int *)&pjVar2[4].start_pass = *(int *)&pjVar2[4].start_pass + -1;
  }
  if (0 < cinfo->blocks_in_MCU) {
    lVar5 = 0;
    do {
      lVar11 = (long)cinfo->MCU_membership[lVar5];
      iVar4 = (int)(*MCU_data[lVar5])[0] >> ((byte)cinfo->Al & 0x1f);
      iVar1 = cinfo->cur_comp_info[lVar11]->dc_tbl_no;
      p_Var9 = (&pjVar2[4].encode_mcu)[iVar1] + *(int *)((long)&pjVar2[3].encode_mcu + lVar11 * 4);
      iVar6 = iVar4 - *(int *)((long)&pjVar2[2].finish_pass + lVar11 * 4);
      if (iVar6 == 0) {
        arith_encode(cinfo,(uchar *)p_Var9,0);
        *(undefined4 *)((long)&pjVar2[3].encode_mcu + lVar11 * 4) = 0;
      }
      else {
        *(int *)((long)&pjVar2[2].finish_pass + lVar11 * 4) = iVar4;
        arith_encode(cinfo,(uchar *)p_Var9,1);
        uVar10 = 0;
        bVar3 = iVar6 < 1;
        if (bVar3) {
          iVar6 = -iVar6;
          local_5c = 8;
          lVar12 = 3;
        }
        else {
          local_5c = 4;
          lVar12 = 2;
        }
        arith_encode(cinfo,(uchar *)(p_Var9 + 1),(uint)bVar3);
        p_Var9 = p_Var9 + lVar12;
        *(undefined4 *)((long)&pjVar2[3].encode_mcu + lVar11 * 4) = local_5c;
        uVar7 = iVar6 - 1;
        if (uVar7 != 0) {
          uVar10 = 1;
          arith_encode(cinfo,(uchar *)p_Var9,1);
          p_Var9 = (&pjVar2[4].encode_mcu)[iVar1] + 0x14;
          if (uVar7 != 1) {
            uVar10 = 1;
            uVar8 = uVar7;
            do {
              arith_encode(cinfo,(uchar *)p_Var9,1);
              uVar10 = uVar10 * 2;
              p_Var9 = p_Var9 + 1;
              bVar3 = 3 < uVar8;
              uVar8 = uVar8 >> 1;
            } while (bVar3);
          }
        }
        iVar4 = 0;
        arith_encode(cinfo,(uchar *)p_Var9,0);
        if ((int)uVar10 < (int)((ulong)(1L << (cinfo->arith_dc_L[iVar1] & 0x3f)) >> 1)) {
LAB_0013584f:
          *(int *)((long)&pjVar2[3].encode_mcu + lVar11 * 4) = iVar4;
        }
        else if ((int)((ulong)(1L << (cinfo->arith_dc_U[iVar1] & 0x3f)) >> 1) < (int)uVar10) {
          iVar4 = *(int *)((long)&pjVar2[3].encode_mcu + lVar11 * 4) + 8;
          goto LAB_0013584f;
        }
        if (1 < uVar10) {
          do {
            uVar10 = (int)uVar10 >> 1;
            arith_encode(cinfo,(uchar *)(p_Var9 + 0xe),(uint)((uVar10 & uVar7) != 0));
          } while (1 < uVar10);
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < cinfo->blocks_in_MCU);
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_DC_first(j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr)cinfo->entropy;
  JBLOCKROW block;
  unsigned char *st;
  int blkn, ci, tbl;
  int v, v2, m;
  ISHIFT_TEMPS

  /* Emit restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      emit_restart(cinfo, entropy->next_restart_num);
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  /* Encode the MCU data blocks */
  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data[blkn];
    ci = cinfo->MCU_membership[blkn];
    tbl = cinfo->cur_comp_info[ci]->dc_tbl_no;

    /* Compute the DC value after the required point transform by Al.
     * This is simply an arithmetic right shift.
     */
    m = IRIGHT_SHIFT((int)((*block)[0]), cinfo->Al);

    /* Sections F.1.4.1 & F.1.4.4.1: Encoding of DC coefficients */

    /* Table F.4: Point to statistics bin S0 for DC coefficient coding */
    st = entropy->dc_stats[tbl] + entropy->dc_context[ci];

    /* Figure F.4: Encode_DC_DIFF */
    if ((v = m - entropy->last_dc_val[ci]) == 0) {
      arith_encode(cinfo, st, 0);
      entropy->dc_context[ci] = 0;      /* zero diff category */
    } else {
      entropy->last_dc_val[ci] = m;
      arith_encode(cinfo, st, 1);
      /* Figure F.6: Encoding nonzero value v */
      /* Figure F.7: Encoding the sign of v */
      if (v > 0) {
        arith_encode(cinfo, st + 1, 0); /* Table F.4: SS = S0 + 1 */
        st += 2;                        /* Table F.4: SP = S0 + 2 */
        entropy->dc_context[ci] = 4;    /* small positive diff category */
      } else {
        v = -v;
        arith_encode(cinfo, st + 1, 1); /* Table F.4: SS = S0 + 1 */
        st += 3;                        /* Table F.4: SN = S0 + 3 */
        entropy->dc_context[ci] = 8;    /* small negative diff category */
      }
      /* Figure F.8: Encoding the magnitude category of v */
      m = 0;
      if (v -= 1) {
        arith_encode(cinfo, st, 1);
        m = 1;
        v2 = v;
        st = entropy->dc_stats[tbl] + 20; /* Table F.4: X1 = 20 */
        while (v2 >>= 1) {
          arith_encode(cinfo, st, 1);
          m <<= 1;
          st += 1;
        }
      }
      arith_encode(cinfo, st, 0);
      /* Section F.1.4.4.1.2: Establish dc_context conditioning category */
      if (m < (int)((1L << cinfo->arith_dc_L[tbl]) >> 1))
        entropy->dc_context[ci] = 0;    /* zero diff category */
      else if (m > (int)((1L << cinfo->arith_dc_U[tbl]) >> 1))
        entropy->dc_context[ci] += 8;   /* large diff category */
      /* Figure F.9: Encoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
        arith_encode(cinfo, st, (m & v) ? 1 : 0);
    }
  }

  return TRUE;
}